

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O0

void __thiscall
cmsys::Encoding::CommandLineArguments::~CommandLineArguments(CommandLineArguments *this)

{
  size_type sVar1;
  reference ppcVar2;
  undefined8 local_18;
  size_t i;
  CommandLineArguments *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<char_*,_std::allocator<char_*>_>::size(&this->argv_);
    if (sVar1 <= local_18) break;
    ppcVar2 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&this->argv_,local_18);
    free(*ppcVar2);
    local_18 = local_18 + 1;
  }
  std::vector<char_*,_std::allocator<char_*>_>::~vector(&this->argv_);
  return;
}

Assistant:

Encoding::CommandLineArguments::~CommandLineArguments()
{
  for(size_t i=0; i<this->argv_.size(); i++)
    {
    free(argv_[i]);
    }
}